

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  uchar uVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uchar *puVar14;
  uint uVar15;
  byte *pbVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  
  puVar8 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      pbrt::LogFatal<char_const(&)[31]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/stb/stb_image.h"
                 ,0x6a4,"Check failed: %s",(char (*) [31])"req_comp >= 1 && req_comp <= 4");
    }
    puVar8 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar8 == (uchar *)0x0) {
      free(data);
      puVar8 = (uchar *)0x0;
      *(char **)(in_FS_OFFSET + -0x270) = "outofmem";
    }
    else {
      if (0 < (int)y) {
        uVar12 = req_comp + img_n * 8;
        if ((0x23 < uVar12) || ((0xe161a1c00U >> ((ulong)uVar12 & 0x3f) & 1) == 0)) {
          pbrt::LogFatal<char_const(&)[2]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/stb/stb_image.h"
                     ,0x6c1,"Check failed: %s",(char (*) [2])0x2d6d9dd);
        }
        auVar17[8] = 0xff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17[9] = 0xff;
        auVar17[10] = 0xff;
        auVar17[0xb] = 0xff;
        auVar17[0xc] = 0xff;
        auVar17[0xd] = 0xff;
        auVar17[0xe] = 0xff;
        auVar17[0xf] = 0xff;
        iVar1 = x - 1;
        uVar15 = 0;
        uVar11 = 0;
        uVar10 = 0;
        do {
          iVar13 = (int)uVar11 * x;
          if (uVar12 - 10 < 0x19) {
            pbVar16 = data + (uint)(iVar13 * img_n);
            switch(uVar12) {
            case 10:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  puVar8[lVar9 * 2 + uVar10] = data[lVar9 + (ulong)uVar15];
                  puVar8[lVar9 * 2 + uVar10 + 1] = 0xff;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                puVar14 = puVar8 + uVar10 + 2;
                lVar9 = 0;
                do {
                  uVar5 = data[lVar9 + (ulong)uVar15];
                  lVar9 = lVar9 + 1;
                  *puVar14 = uVar5;
                  puVar14[-1] = uVar5;
                  puVar14[-2] = uVar5;
                  puVar14 = puVar14 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  auVar7 = vpinsrb_avx(auVar17,(uint)data[lVar9 + (ulong)uVar15],0);
                  auVar7 = vpshufb_avx(auVar7,SUB6416(ZEXT464(0x1000000),0));
                  *(int *)(puVar8 + lVar9 * 4 + uVar10) = auVar7._0_4_;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            default:
              goto switchD_003171d1_caseD_d;
            case 0x11:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  puVar8[lVar9 + uVar10] = data[lVar9 * 2 + (ulong)uVar15];
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                puVar14 = puVar8 + uVar10 + 2;
                lVar9 = 0;
                do {
                  uVar5 = data[lVar9 * 2 + (ulong)uVar15];
                  lVar9 = lVar9 + 1;
                  *puVar14 = uVar5;
                  puVar14[-1] = uVar5;
                  puVar14[-2] = uVar5;
                  puVar14 = puVar14 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  auVar7 = vpshufb_avx(ZEXT216(*(ushort *)(data + lVar9 * 2 + (ulong)uVar15)),
                                       SUB6416(ZEXT464(0x1000000),0));
                  *(int *)(puVar8 + lVar9 * 4 + uVar10) = auVar7._0_4_;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x19:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  bVar4 = *pbVar16;
                  pbVar2 = pbVar16 + 1;
                  bVar6 = pbVar16[2];
                  pbVar16 = pbVar16 + 3;
                  puVar8[lVar9 + uVar10] =
                       (uchar)((uint)bVar6 * 2 + ((uint)bVar6 + (uint)bVar6 * 8) * 3 +
                               (uint)*pbVar2 * 0x96 + (uint)bVar4 * 0x4d >> 8);
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x1a:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  bVar4 = *pbVar16;
                  pbVar2 = pbVar16 + 1;
                  bVar6 = pbVar16[2];
                  pbVar16 = pbVar16 + 3;
                  puVar8[lVar9 * 2 + uVar10] =
                       (uchar)((uint)bVar6 * 2 + ((uint)bVar6 + (uint)bVar6 * 8) * 3 +
                               (uint)*pbVar2 * 0x96 + (uint)bVar4 * 0x4d >> 8);
                  puVar8[lVar9 * 2 + uVar10 + 1] = 0xff;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x1c:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  puVar8[lVar9 * 4 + uVar10] = *pbVar16;
                  puVar8[lVar9 * 4 + uVar10 + 1] = pbVar16[1];
                  pbVar2 = pbVar16 + 2;
                  pbVar16 = pbVar16 + 3;
                  puVar8[lVar9 * 4 + uVar10 + 2] = *pbVar2;
                  puVar8[lVar9 * 4 + uVar10 + 3] = 0xff;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  bVar4 = data[lVar9 * 4 + (ulong)uVar15 + 2];
                  puVar8[lVar9 + uVar10] =
                       (uchar)((uint)bVar4 * 2 + ((uint)bVar4 + (uint)bVar4 * 8) * 3 +
                               (uint)data[lVar9 * 4 + (ulong)uVar15 + 1] * 0x96 +
                               (uint)data[lVar9 * 4 + (ulong)uVar15] * 0x4d >> 8);
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  bVar4 = data[lVar9 * 4 + (ulong)uVar15 + 2];
                  puVar8[lVar9 * 2 + uVar10] =
                       (uchar)((uint)bVar4 * 2 + ((uint)bVar4 + (uint)bVar4 * 8) * 3 +
                               (uint)data[lVar9 * 4 + (ulong)uVar15 + 1] * 0x96 +
                               (uint)data[lVar9 * 4 + (ulong)uVar15] * 0x4d >> 8);
                  puVar8[lVar9 * 2 + uVar10 + 1] = data[lVar9 * 4 + (ulong)uVar15 + 3];
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
            }
          }
          else {
switchD_003171d1_caseD_d:
            if (-1 < iVar1) {
              lVar9 = 0;
              puVar14 = puVar8 + (uint)(iVar13 * req_comp);
              do {
                *puVar14 = data[lVar9 * 4 + (ulong)uVar15];
                puVar14[1] = data[lVar9 * 4 + (ulong)uVar15 + 1];
                lVar3 = lVar9 * 4;
                lVar9 = lVar9 + 1;
                puVar14[2] = data[lVar3 + (ulong)uVar15 + 2];
                puVar14 = puVar14 + 3;
              } while (x != (uint)lVar9);
            }
          }
          uVar10 = (ulong)((int)uVar10 + x * req_comp);
          uVar15 = uVar15 + x * img_n;
          uVar11 = uVar11 + 1;
        } while (uVar11 != y);
      }
      free(data);
    }
  }
  return puVar8;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}